

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_t *psVar4;
  size_t sVar5;
  BYTE *local_158;
  uint local_148;
  uint local_144;
  long lStack_130;
  U32 mIndex;
  BYTE *match;
  size_t matchLength;
  U32 *nextPtr;
  size_t bestLength;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  BYTE *prefixStart;
  BYTE *dictEnd;
  long lStack_e0;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  uint *puStack_c0;
  U32 nextCandidateIdx;
  U32 *nextCandidateIdxPtr;
  uint local_b0;
  U32 previousCandidate;
  U32 nbCandidates;
  U32 nbCompares;
  U32 *unsortedMark;
  U32 *nextCandidate;
  U32 unsortLimit;
  U32 btLow;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 windowLow;
  U32 curr;
  BYTE *base;
  size_t sStack_68;
  U32 matchIndex;
  size_t h;
  U32 *pUStack_58;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  ZSTD_dictMode_e dictMode_local;
  U32 mls_local;
  size_t *offBasePtr_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  BYTE *local_18;
  size_t local_10;
  
  hashTable = &(ms->cParams).windowLog;
  pUStack_58 = ms->hashTable;
  h._4_4_ = (ms->cParams).hashLog;
  cParams._0_4_ = dictMode;
  cParams._4_4_ = mls;
  _dictMode_local = offBasePtr;
  offBasePtr_local = (size_t *)iend;
  iend_local = ip;
  ip_local = (BYTE *)ms;
  ms_local._0_4_ = mls;
  ms_local._4_4_ = h._4_4_;
  local_18 = ip;
  if (0x20 < h._4_4_) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(mls) {
  default:
    local_10 = ZSTD_hash4Ptr(ip,h._4_4_);
    break;
  case 5:
    local_10 = ZSTD_hash5Ptr(ip,h._4_4_);
    break;
  case 6:
    local_10 = ZSTD_hash6Ptr(ip,h._4_4_);
    break;
  case 7:
    local_10 = ZSTD_hash7Ptr(ip,h._4_4_);
    break;
  case 8:
    local_10 = ZSTD_hash8Ptr(ip,h._4_4_);
  }
  sStack_68 = local_10;
  base._4_4_ = pUStack_58[local_10];
  _windowLow = *(long *)(ip_local + 8);
  bt._4_4_ = (int)iend_local - (int)_windowLow;
  bt._0_4_ = ZSTD_getLowestMatchIndex((ZSTD_matchState_t *)ip_local,bt._4_4_,*hashTable);
  _btMask = *(long *)(ip_local + 0x80);
  btLow = hashTable[1] - 1;
  unsortLimit = (1 << ((byte)btLow & 0x1f)) - 1;
  if (unsortLimit < bt._4_4_) {
    local_144 = bt._4_4_ - unsortLimit;
  }
  else {
    local_144 = 0;
  }
  nextCandidate._4_4_ = local_144;
  local_148 = (U32)bt;
  if ((U32)bt < local_144) {
    local_148 = local_144;
  }
  nextCandidate._0_4_ = local_148;
  unsortedMark = (U32 *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4);
  _nbCandidates = (uint *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4 + 4);
  previousCandidate = 1 << ((byte)hashTable[3] & 0x1f);
  nextCandidateIdxPtr._4_4_ = 0;
  local_b0 = previousCandidate;
  if (offBasePtr_local + -1 < iend_local) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x107,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ZSTD_dictMode_e)cParams == ZSTD_dedicatedDictSearch) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x108,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  while( true ) {
    bVar1 = false;
    if ((local_148 < base._4_4_) && (bVar1 = false, *_nbCandidates == 1)) {
      bVar1 = 1 < local_b0;
    }
    if (!bVar1) break;
    *_nbCandidates = nextCandidateIdxPtr._4_4_;
    nextCandidateIdxPtr._4_4_ = base._4_4_;
    base._4_4_ = *unsortedMark;
    unsortedMark = (U32 *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4);
    _nbCandidates = (uint *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4 + 4);
    local_b0 = local_b0 - 1;
  }
  if ((local_148 < base._4_4_) && (*_nbCandidates == 1)) {
    *_nbCandidates = 0;
    *unsortedMark = 0;
  }
  base._4_4_ = nextCandidateIdxPtr._4_4_;
  while (base._4_4_ != 0) {
    puStack_c0 = (uint *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4 + 4);
    commonLengthSmaller._4_4_ = *puStack_c0;
    ZSTD_insertDUBT1((ZSTD_matchState_t *)ip_local,base._4_4_,(BYTE *)offBasePtr_local,local_b0,
                     (uint)nextCandidate,(ZSTD_dictMode_e)cParams);
    local_b0 = local_b0 + 1;
    base._4_4_ = commonLengthSmaller._4_4_;
  }
  commonLengthLarger = 0;
  dictBase = (BYTE *)0x0;
  lStack_e0 = *(long *)(ip_local + 0x10);
  dictEnd._4_4_ = *(uint *)(ip_local + 0x18);
  prefixStart = (BYTE *)(lStack_e0 + (ulong)dictEnd._4_4_);
  smallerPtr = (U32 *)(_windowLow + (ulong)dictEnd._4_4_);
  largerPtr = (U32 *)(_btMask + (ulong)((bt._4_4_ & unsortLimit) << 1) * 4);
  _dummy32 = (size_t *)(_btMask + (ulong)((bt._4_4_ & unsortLimit) << 1) * 4 + 4);
  bestLength._4_4_ = bt._4_4_ + 9;
  nextPtr = (U32 *)0x0;
  base._4_4_ = pUStack_58[sStack_68];
  pUStack_58[sStack_68] = bt._4_4_;
  do {
    if (previousCandidate == 0 || base._4_4_ <= (U32)bt) {
LAB_003e2cc8:
      *(undefined4 *)_dummy32 = 0;
      *largerPtr = 0;
      if (0x40000000 < previousCandidate) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x16b,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      if (((ZSTD_dictMode_e)cParams == ZSTD_dictMatchState) && (previousCandidate != 0)) {
        nextPtr = (U32 *)ZSTD_DUBT_findBetterDictMatch
                                   ((ZSTD_matchState_t *)ip_local,iend_local,
                                    (BYTE *)offBasePtr_local,_dictMode_local,(size_t)nextPtr,
                                    previousCandidate,cParams._4_4_,ZSTD_dictMatchState);
      }
      if (bt._4_4_ + 8 < bestLength._4_4_) {
        *(uint *)(ip_local + 0x2c) = bestLength._4_4_ - 8;
        if (((U32 *)0x2 < nextPtr) && (*_dictMode_local < 4)) {
          __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x176,
                        "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                       );
        }
        return (size_t)nextPtr;
      }
      __assert_fail("matchEndIdx > curr+8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x173,
                    "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                   );
    }
    psVar4 = (size_t *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4);
    if (commonLengthLarger < dictBase) {
      local_158 = (BYTE *)commonLengthLarger;
    }
    else {
      local_158 = dictBase;
    }
    if (((ZSTD_dictMode_e)cParams == ZSTD_extDict) &&
       (local_158 + base._4_4_ < (BYTE *)(ulong)dictEnd._4_4_)) {
      lStack_130 = lStack_e0 + (ulong)base._4_4_;
      sVar5 = ZSTD_count_2segments
                        (iend_local + (long)local_158,local_158 + lStack_130,
                         (BYTE *)offBasePtr_local,prefixStart,(BYTE *)smallerPtr);
      match = local_158 + sVar5;
      if ((BYTE *)(ulong)dictEnd._4_4_ <= match + base._4_4_) {
        lStack_130 = _windowLow + (ulong)base._4_4_;
      }
    }
    else {
      lStack_130 = _windowLow + (ulong)base._4_4_;
      sVar5 = ZSTD_count(iend_local + (long)local_158,local_158 + lStack_130,
                         (BYTE *)offBasePtr_local);
      match = local_158 + sVar5;
    }
    if (nextPtr < match) {
      if ((BYTE *)(ulong)(bestLength._4_4_ - base._4_4_) < match) {
        bestLength._4_4_ = base._4_4_ + (int)match;
      }
      uVar2 = ZSTD_highbit32((bt._4_4_ - base._4_4_) + 1);
      uVar3 = ZSTD_highbit32((U32)*_dictMode_local);
      if ((int)(uVar2 - uVar3) < ((int)match - (int)nextPtr) * 4) {
        nextPtr = (U32 *)match;
        if (bt._4_4_ == base._4_4_) {
          __assert_fail("(curr - matchIndex)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x14e,
                        "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                       );
        }
        *_dictMode_local = (ulong)((bt._4_4_ - base._4_4_) + 3);
      }
      if ((size_t *)(iend_local + (long)match) == offBasePtr_local) {
        if ((ZSTD_dictMode_e)cParams == ZSTD_dictMatchState) {
          previousCandidate = 0;
        }
        goto LAB_003e2cc8;
      }
    }
    if (match[lStack_130] < iend_local[(long)match]) {
      *largerPtr = base._4_4_;
      commonLengthLarger = (size_t)match;
      if (base._4_4_ <= nextCandidate._4_4_) {
        largerPtr = (U32 *)&bestLength;
        goto LAB_003e2cc8;
      }
      largerPtr = (U32 *)((long)psVar4 + 4);
      base._4_4_ = *(uint *)((long)psVar4 + 4);
    }
    else {
      *(U32 *)_dummy32 = base._4_4_;
      dictBase = match;
      if (base._4_4_ <= nextCandidate._4_4_) {
        _dummy32 = &bestLength;
        goto LAB_003e2cc8;
      }
      base._4_4_ = (U32)*psVar4;
      _dummy32 = psVar4;
    }
    previousCandidate = previousCandidate - 1;
  } while( true );
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}